

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Dump.c
# Opt level: O3

void Llb_ManDumpReached(DdManager *ddG,DdNode *bReached,char *pModel,char *pFileName)

{
  char **inames;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint *__ptr;
  void *pvVar5;
  char *pcVar6;
  char **onames;
  FILE *__stream;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  DdNode *bReached_local;
  
  bReached_local = bReached;
  Cudd_ReduceHeap(ddG,CUDD_REORDER_SYMM_SIFT,1);
  uVar2 = Cudd_ReadSize(ddG);
  if (1 < uVar2) {
    uVar3 = uVar2 - 1;
    uVar2 = 0;
    do {
      uVar2 = uVar2 + 1;
      bVar1 = 9 < uVar3;
      uVar3 = uVar3 / 10;
    } while (bVar1);
  }
  uVar3 = Cudd_ReadSize(ddG);
  __ptr = (uint *)malloc(0x10);
  uVar9 = 8;
  if (6 < uVar3 - 1) {
    uVar9 = (ulong)uVar3;
  }
  __ptr[1] = 0;
  uVar7 = 0;
  if ((int)uVar9 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = malloc((long)(int)uVar9 << 3);
  }
  *(void **)(__ptr + 2) = pvVar5;
  iVar4 = Cudd_ReadSize(ddG);
  if (0 < iVar4) {
    uVar8 = 0;
    do {
      sprintf(Llb_ManGetDummyName::Buffer,"%s%0*d","ff",(ulong)uVar2,uVar8 & 0xffffffff);
      pcVar6 = Extra_UtilStrsav(Llb_ManGetDummyName::Buffer);
      iVar4 = (int)uVar9;
      if ((int)uVar8 == iVar4) {
        if (iVar4 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar5 = malloc(0x80);
          }
          else {
            pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
          }
          *(void **)(__ptr + 2) = pvVar5;
          *__ptr = 0x10;
          uVar9 = 0x10;
        }
        else {
          uVar9 = (ulong)(uint)(iVar4 * 2);
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar5 = malloc(uVar9 * 8);
          }
          else {
            pvVar5 = realloc(*(void **)(__ptr + 2),uVar9 * 8);
          }
          *(void **)(__ptr + 2) = pvVar5;
          *__ptr = iVar4 * 2;
        }
      }
      else {
        pvVar5 = *(void **)(__ptr + 2);
      }
      uVar7 = uVar8 + 1;
      __ptr[1] = (uint)uVar7;
      *(char **)((long)pvVar5 + uVar8 * 8) = pcVar6;
      iVar4 = Cudd_ReadSize(ddG);
      uVar8 = uVar7;
    } while ((int)(uint)uVar7 < iVar4);
  }
  onames = (char **)malloc(0x40);
  pcVar6 = Extra_UtilStrsav("Reached");
  *onames = pcVar6;
  __stream = fopen(pFileName,"wb");
  inames = *(char ***)(__ptr + 2);
  Cudd_DumpBlif(ddG,1,&bReached_local,inames,onames,pModel,(FILE *)__stream,0);
  fclose(__stream);
  if (0 < (int)uVar7) {
    uVar9 = 0;
    do {
      if (inames[uVar9] != (char *)0x0) {
        free(inames[uVar9]);
      }
      uVar9 = uVar9 + 1;
    } while ((uVar7 & 0xffffffff) != uVar9);
  }
  if (*onames != (char *)0x0) {
    free(*onames);
  }
  if (inames != (char **)0x0) {
    free(inames);
  }
  free(__ptr);
  free(onames);
  return;
}

Assistant:

void Llb_ManDumpReached( DdManager * ddG, DdNode * bReached, char * pModel, char * pFileName )
{
    FILE * pFile;
    Vec_Ptr_t * vNamesIn, * vNamesOut;
    char * pName;
    int i, nDigits;
    // reorder the BDD
    Cudd_ReduceHeap( ddG, CUDD_REORDER_SYMM_SIFT, 1 );

    // create input names
    nDigits = Abc_Base10Log( Cudd_ReadSize(ddG) );
    vNamesIn = Vec_PtrAlloc( Cudd_ReadSize(ddG) );
    for ( i = 0; i < Cudd_ReadSize(ddG); i++ )
    {
        pName = Llb_ManGetDummyName( "ff", i, nDigits );
        Vec_PtrPush( vNamesIn, Extra_UtilStrsav(pName) );
    }
    // create output names
    vNamesOut = Vec_PtrAlloc( 1 );
    Vec_PtrPush( vNamesOut, Extra_UtilStrsav("Reached") );

    // write the file
    pFile = fopen( pFileName, "wb" );
    Cudd_DumpBlif( ddG, 1, &bReached, (char **)Vec_PtrArray(vNamesIn), (char **)Vec_PtrArray(vNamesOut), pModel, pFile, 0 );
    fclose( pFile );

    // cleanup
    Vec_PtrForEachEntry( char *, vNamesIn, pName, i )
        ABC_FREE( pName );
    Vec_PtrForEachEntry( char *, vNamesOut, pName, i )
        ABC_FREE( pName );
    Vec_PtrFree( vNamesIn );
    Vec_PtrFree( vNamesOut );
}